

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.hpp
# Opt level: O1

void __thiscall
pstore::indirect_string::indirect_string
          (indirect_string *this,database *db,
          not_null<const_pstore::sstring_view<const_char_*>_*> str)

{
  this->db_ = db;
  this->is_pointer_ = true;
  this->field_2 = (anon_union_8_2_d34ab9e4_for_indirect_string_3)str.ptr_;
  if (((ulong)str.ptr_ & 1) == 0) {
    return;
  }
  assert_failed("(reinterpret_cast<std::uintptr_t> (str.get ()) & in_heap_mask) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/indirect_string.hpp"
                ,0x3a);
}

Assistant:

constexpr indirect_string (database const & db,
                                   gsl::not_null<raw_sstring_view const *> const str) noexcept
                : db_{db}
                , is_pointer_{true}
                , str_{str} {
            PSTORE_ASSERT ((reinterpret_cast<std::uintptr_t> (str.get ()) & in_heap_mask) == 0);
        }